

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

void __thiscall
PartiallySignedTransaction::Serialize<DataStream>(PartiallySignedTransaction *this,DataStream *s)

{
  _Base_ptr p_Var1;
  PSBTInput *pPVar2;
  PSBTOutput *pPVar3;
  KeyOriginInfo hd_keypath;
  _Base_ptr p_Var4;
  map<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *pmVar5;
  uint32_t uVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  PSBTInput *input;
  PSBTInput *this_00;
  PSBTOutput *this_01;
  long in_FS_OFFSET;
  uchar ser_xpub [78];
  undefined8 in_stack_ffffffffffffff38;
  PartiallySignedTransaction *pPVar10;
  KeyOriginInfo local_a8;
  ParamsWrapper<TransactionSerParams,_const_CMutableTransaction> local_88 [5];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<DataStream,_unsigned_char,_5>(s,&PSBT_MAGIC_BYTES);
  local_88[0].m_params = (TransactionSerParams *)0x0;
  SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)local_88);
  local_88[0].m_params = &::TX_NO_WITNESS;
  local_88[0].m_object = (CMutableTransaction *)this;
  SerializeToVector<DataStream,ParamsWrapper<TransactionSerParams,CMutableTransaction_const>>
            (s,local_88);
  p_Var9 = &(this->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (p_Var8 = (this->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var8 != p_Var9; p_Var8 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8)) {
    p_Var1 = p_Var8 + 1;
    p_Var4 = p_Var8 + 2;
    for (p_Var7 = p_Var8[2]._M_right; p_Var7 != (_Base_ptr)&p_Var4->_M_parent;
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7)) {
      CExtPubKey::EncodeWithVersion((CExtPubKey *)(p_Var7 + 1),(uchar *)local_88);
      SerializeToVector<DataStream,unsigned_char,unsigned_char[78]>
                (s,"\x01",(uchar (*) [78])local_88);
      KeyOriginInfo::KeyOriginInfo(&local_a8,(KeyOriginInfo *)p_Var1);
      hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)this;
      hd_keypath.fingerprint[0] = (char)in_stack_ffffffffffffff38;
      hd_keypath.fingerprint[1] = (char)((ulong)in_stack_ffffffffffffff38 >> 8);
      hd_keypath.fingerprint[2] = (char)((ulong)in_stack_ffffffffffffff38 >> 0x10);
      hd_keypath.fingerprint[3] = (char)((ulong)in_stack_ffffffffffffff38 >> 0x18);
      hd_keypath._4_4_ = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
      hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = &p_Var9->_M_color;
      hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = &p_Var8->_M_color;
      SerializeHDKeypath<DataStream>(s,hd_keypath);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&local_a8.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
  }
  pPVar10 = this;
  uVar6 = GetVersion(this);
  if (uVar6 != 0) {
    local_88[0].m_params = (TransactionSerParams *)0xfb;
    SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)local_88);
    SerializeToVector<DataStream,unsigned_int>(s,(uint *)&this->m_version);
  }
  for (p_Var9 = (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != &(this->m_proprietary)._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var9 + 2));
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var9[2]._M_right);
  }
  pmVar5 = &pPVar10->unknown;
  for (p_Var9 = (pPVar10->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9)) {
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var9 + 1));
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var9[1]._M_right);
  }
  DataStream::operator<<(s,"");
  pPVar2 = (pPVar10->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (pPVar10->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl
                 .super__Vector_impl_data._M_start; this_00 != pPVar2; this_00 = this_00 + 1) {
    PSBTInput::Serialize<DataStream>(this_00,s);
  }
  pPVar3 = (pPVar10->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_01 = (pPVar10->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_01 != pPVar3; this_01 = this_01 + 1)
  {
    PSBTOutput::Serialize<DataStream>(this_01,s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void Serialize(Stream& s) const {

        // magic bytes
        s << PSBT_MAGIC_BYTES;

        // unsigned tx flag
        SerializeToVector(s, CompactSizeWriter(PSBT_GLOBAL_UNSIGNED_TX));

        // Write serialized tx to a stream
        SerializeToVector(s, TX_NO_WITNESS(*tx));

        // Write xpubs
        for (const auto& xpub_pair : m_xpubs) {
            for (const auto& xpub : xpub_pair.second) {
                unsigned char ser_xpub[BIP32_EXTKEY_WITH_VERSION_SIZE];
                xpub.EncodeWithVersion(ser_xpub);
                // Note that the serialization swaps the key and value
                // The xpub is the key (for uniqueness) while the path is the value
                SerializeToVector(s, PSBT_GLOBAL_XPUB, ser_xpub);
                SerializeHDKeypath(s, xpub_pair.first);
            }
        }

        // PSBT version
        if (GetVersion() > 0) {
            SerializeToVector(s, CompactSizeWriter(PSBT_GLOBAL_VERSION));
            SerializeToVector(s, *m_version);
        }

        // Write proprietary things
        for (const auto& entry : m_proprietary) {
            s << entry.key;
            s << entry.value;
        }

        // Write the unknown things
        for (auto& entry : unknown) {
            s << entry.first;
            s << entry.second;
        }

        // Separator
        s << PSBT_SEPARATOR;

        // Write inputs
        for (const PSBTInput& input : inputs) {
            s << input;
        }
        // Write outputs
        for (const PSBTOutput& output : outputs) {
            s << output;
        }
    }